

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  ValueHolder VVar5;
  ulong __n;
  ValueHolder VVar6;
  double value;
  Char buffer [33];
  double local_a0;
  ValueHolder local_98;
  long local_90;
  size_type local_88;
  long lStack_80;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  ValueHolder local_50 [2];
  undefined1 local_40 [16];
  
  local_a0 = 0.0;
  __n = (long)token->end_ - (long)token->start_;
  if ((long)__n < 0) {
    VVar6.string_ = (char *)&local_88;
    local_98.string_ = VVar6.string_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Unable to parse token length","");
    addError(this,(String *)&local_98,token,(Location)0x0);
    VVar5 = local_98;
  }
  else {
    if (__n < 0x21) {
      memcpy(&local_98,token->start_,__n);
      *(char *)((long)&local_98 + __n) = '\0';
      fixNumericLocaleInput<char*>((char *)&local_98.int_,(char *)((long)&local_98 + __n));
      iVar1 = __isoc99_sscanf(&local_98,&DAT_0015c4c4,&local_a0);
    }
    else {
      local_98.string_ = (char *)&local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98);
      iVar1 = __isoc99_sscanf(local_98.int_,&DAT_0015c4c4,&local_a0);
      if (local_98 != &local_88) {
        operator_delete(local_98.string_);
      }
    }
    if (iVar1 == 1) {
      Value::Value((Value *)&local_98,local_a0);
      Value::operator=(decoded,(Value *)&local_98);
      Value::~Value((Value *)&local_98);
      return true;
    }
    VVar6.string_ = local_40;
    local_50[0].string_ = VVar6.string_;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,token->start_,token->end_);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x15be08);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      local_88 = *psVar4;
      lStack_80 = plVar2[3];
      local_98.string_ = (char *)&local_88;
    }
    else {
      local_88 = *psVar4;
      local_98.string_ = ((char *)*plVar2).string_;
    }
    local_90 = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    addError(this,(String *)&local_98,token,(Location)0x0);
    if (local_98 != &local_88) {
      operator_delete(local_98.string_);
    }
    VVar5 = local_50[0];
    if (local_70 != &local_60) {
      operator_delete(local_70);
      VVar5 = local_50[0];
    }
  }
  if (VVar5.int_ != VVar6.int_) {
    operator_delete(VVar5.string_);
  }
  return false;
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  ptrdiff_t const length = token.end_ - token.start_;

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }
  auto const ulength = static_cast<size_t>(length);

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, ulength);
    buffer[length] = 0;
    fixNumericLocaleInput(buffer, buffer + length);
    count = sscanf(buffer, format, &value);
  } else {
    String buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError(
        "'" + String(token.start_, token.end_) + "' is not a number.", token);
  decoded = value;
  return true;
}